

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundParameterExpression::Deserialize
          (BoundParameterExpression *this,Deserializer *deserializer)

{
  BoundParameterExpression *this_00;
  bound_parameter_map_t *global_parameter_set;
  shared_ptr<duckdb::BoundParameterData,_true> parameter_data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> identifier;
  LogicalType return_type;
  undefined1 local_c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_c0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  LogicalType local_70;
  shared_ptr<duckdb::BoundParameterData,_true> local_58;
  LogicalType local_48;
  
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (&local_b0,deserializer,200,"identifier");
  Deserializer::ReadProperty<duckdb::LogicalType>(&local_70,deserializer,0xc9,"return_type");
  Deserializer::ReadPropertyWithDefault<duckdb::shared_ptr<duckdb::BoundParameterData,true>>
            ((Deserializer *)local_c8,(field_id_t)deserializer,(char *)0xca);
  this_00 = (BoundParameterExpression *)operator_new(0x88);
  global_parameter_set =
       SerializationData::
       Get<std::unordered_map<std::__cxx11::string,duckdb::shared_ptr<duckdb::BoundParameterData,true>,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::shared_ptr<duckdb::BoundParameterData,true>>>>&>
                 (&deserializer->data);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
    local_90.field_2._8_8_ = local_b0.field_2._8_8_;
  }
  else {
    local_90._M_dataplus._M_p = local_b0._M_dataplus._M_p;
  }
  local_90._M_string_length = local_b0._M_string_length;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  LogicalType::LogicalType(&local_48,&local_70);
  local_58.internal.super___shared_ptr<duckdb::BoundParameterData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_c8;
  local_58.internal.super___shared_ptr<duckdb::BoundParameterData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = a_Stack_c0[0]._M_pi;
  local_c8 = (undefined1  [8])0x0;
  a_Stack_c0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  BoundParameterExpression(this_00,global_parameter_set,&local_90,&local_48,&local_58);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.internal.
              super___shared_ptr<duckdb::BoundParameterData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  LogicalType::~LogicalType(&local_48);
  ::std::__cxx11::string::~string((string *)&local_90);
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression = (_func_int **)this_00;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_c0);
  LogicalType::~LogicalType(&local_70);
  ::std::__cxx11::string::~string((string *)&local_b0);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundParameterExpression::Deserialize(Deserializer &deserializer) {
	auto identifier = deserializer.ReadPropertyWithDefault<string>(200, "identifier");
	auto return_type = deserializer.ReadProperty<LogicalType>(201, "return_type");
	auto parameter_data = deserializer.ReadPropertyWithDefault<shared_ptr<BoundParameterData>>(202, "parameter_data");
	auto result = duckdb::unique_ptr<BoundParameterExpression>(new BoundParameterExpression(deserializer.Get<bound_parameter_map_t &>(), std::move(identifier), std::move(return_type), std::move(parameter_data)));
	return std::move(result);
}